

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int tinyexr::DecodeChunk
              (EXRImage *exr_image,EXRHeader *exr_header,
              vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *offsets,uchar *head)

{
  uchar *puVar1;
  int compression_type;
  int line_order;
  int x_stride;
  int height;
  int iVar2;
  int iVar3;
  pointer puVar4;
  pointer puVar5;
  EXRChannelInfo *pEVar6;
  EXRAttribute *attributes;
  int num_lines;
  undefined8 uVar7;
  undefined8 uVar8;
  int width;
  int c;
  int iVar9;
  int data_height;
  int extraout_EAX;
  EXRTile *pEVar10;
  uchar **ppuVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int *piVar16;
  unsigned_long uVar17;
  size_type sVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  size_t y_idx;
  long lVar23;
  ulong uVar24;
  size_type __new_size;
  bool bVar25;
  EXRChannelInfo *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  int num_channels;
  vector<unsigned_long,_std::allocator<unsigned_long>_> channel_offset_list;
  
  num_channels = exr_header->num_channels;
  iVar9 = exr_header->compression_type;
  __new_size = (size_type)num_channels;
  iVar12 = 0x10;
  if ((iVar9 != 3) && (iVar9 != 0x80)) {
    if (iVar9 == 4) {
      iVar12 = 0x20;
    }
    else {
      iVar12 = 1;
    }
  }
  iVar13 = exr_header->data_window[2] - exr_header->data_window[0];
  iVar21 = exr_header->data_window[3] - exr_header->data_window[1];
  puVar4 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  puVar5 = (offsets->super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pEVar6 = exr_header->channels;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&channel_offset_list,__new_size);
  iVar9 = iVar13 + 1;
  data_height = iVar21 + 1;
  uVar14 = (ulong)((long)puVar4 - (long)puVar5) >> 3;
  piVar16 = &pEVar6->pixel_type;
  iVar22 = 0;
  uVar17 = 0;
  for (sVar18 = 0; __new_size != sVar18; sVar18 = sVar18 + 1) {
    channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[sVar18] = uVar17;
    uVar20 = (ulong)(uint)*piVar16;
    if (uVar20 < 3) {
      iVar22 = iVar22 + *(int *)(&DAT_00146520 + uVar20 * 4);
      uVar17 = uVar17 + *(long *)(&DAT_00146530 + uVar20 * 8);
    }
    piVar16 = piVar16 + 0x44;
  }
  if (exr_header->tiled == 0) {
    ppuVar11 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                             iVar9,data_height);
    exr_image->images = ppuVar11;
    uVar24 = 0;
    uVar20 = uVar14 & 0xffffffff;
    if ((int)uVar14 < 1) {
      uVar20 = uVar24;
    }
    for (; uVar20 != uVar24; uVar24 = uVar24 + 1) {
      puVar1 = head + (offsets->
                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                      _M_impl.super__Vector_impl_data._M_start[uVar24] + 8;
      iVar13 = *(int *)(puVar1 + -8);
      iVar21 = exr_header->data_window[3] + 1;
      if (iVar13 + iVar12 <= iVar21) {
        iVar21 = iVar13 + iVar12;
      }
      DecodePixelData(exr_image->images,exr_header->requested_pixel_types,puVar1,
                      (long)*(int *)(puVar1 + -4),exr_header->compression_type,
                      exr_header->line_order,iVar9,data_height,iVar9,(int)uVar24,
                      iVar13 - exr_header->data_window[1],iVar21 - iVar13,(long)iVar22,
                      (long)exr_header->num_channels,(EXRAttribute *)exr_header->channels,
                      (size_t)&channel_offset_list,in_stack_ffffffffffffff38,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(num_channels,in_stack_ffffffffffffff40));
    }
  }
  else {
    lVar19 = (long)(offsets->
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(offsets->
                   super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>).
                   _M_impl.super__Vector_impl_data._M_start;
    lVar15 = lVar19 >> 3;
    pEVar10 = (EXRTile *)malloc(lVar19 * 4);
    exr_image->tiles = pEVar10;
    lVar23 = 0;
    lVar19 = lVar15;
    while (bVar25 = lVar19 != 0, lVar19 = lVar19 + -1, bVar25) {
      ppuVar11 = AllocateImage(num_channels,exr_header->channels,exr_header->requested_pixel_types,
                               iVar9,data_height);
      pEVar10 = exr_image->tiles;
      *(uchar ***)((long)&pEVar10->images + lVar23 * 4) = ppuVar11;
      puVar1 = head + *(long *)((long)(offsets->
                                      super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar23) + 0x14;
      uVar7 = *(undefined8 *)(puVar1 + -0x14);
      uVar8 = *(undefined8 *)(puVar1 + -0xc);
      iVar12 = *(int *)(puVar1 + -4);
      piVar16 = exr_header->requested_pixel_types;
      compression_type = exr_header->compression_type;
      line_order = exr_header->line_order;
      x_stride = exr_header->tile_size_x;
      height = exr_header->tile_size_y;
      iVar2 = *(int *)(puVar1 + -0x10);
      width = iVar9 - *(int *)(puVar1 + -0x14) * x_stride;
      if ((*(int *)(puVar1 + -0x14) + 1) * x_stride <= iVar13) {
        width = x_stride;
      }
      iVar3 = exr_header->num_channels;
      attributes = (EXRAttribute *)exr_header->channels;
      (&pEVar10->width)[lVar23] = width;
      num_lines = data_height - iVar2 * height;
      if ((iVar2 + 1) * height <= iVar21) {
        num_lines = height;
      }
      (&pEVar10->height)[lVar23] = num_lines;
      DecodePixelData(ppuVar11,piVar16,puVar1,(long)iVar12,compression_type,line_order,width,height,
                      x_stride,0,0,num_lines,(long)iVar22,(long)iVar3,attributes,
                      (size_t)&channel_offset_list,in_stack_ffffffffffffff38,
                      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      CONCAT44(num_channels,in_stack_ffffffffffffff40));
      piVar16 = &exr_image->tiles->offset_x + lVar23;
      *(undefined8 *)piVar16 = uVar7;
      *(undefined8 *)(piVar16 + 2) = uVar8;
      exr_image->num_tiles = (int)lVar15;
      lVar23 = lVar23 + 8;
    }
  }
  for (lVar19 = 0; lVar19 < exr_header->num_channels; lVar19 = lVar19 + 1) {
    exr_header->pixel_types[lVar19] = exr_header->requested_pixel_types[lVar19];
  }
  exr_image->num_channels = num_channels;
  exr_image->width = iVar9;
  exr_image->height = data_height;
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&channel_offset_list.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
  ;
  return extraout_EAX;
}

Assistant:

static int DecodeChunk(EXRImage *exr_image, const EXRHeader *exr_header,
                       const std::vector<unsigned long long> &offsets,
                       const unsigned char *head) {
  int num_channels = exr_header->num_channels;

  int num_scanline_blocks = 1;
  if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZIP) {
    num_scanline_blocks = 16;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_PIZ) {
    num_scanline_blocks = 32;
  } else if (exr_header->compression_type == TINYEXR_COMPRESSIONTYPE_ZFP) {
    num_scanline_blocks = 16;
  }

  int data_width = exr_header->data_window[2] - exr_header->data_window[0] + 1;
  int data_height = exr_header->data_window[3] - exr_header->data_window[1] + 1;

  size_t num_blocks = offsets.size();

  std::vector<size_t> channel_offset_list;
  int pixel_data_size = 0;
  size_t channel_offset = 0;
  tinyexr::ComputeChannelLayout(&channel_offset_list, &pixel_data_size,
                                &channel_offset, num_channels,
                                exr_header->channels);

  if (exr_header->tiled) {
    size_t num_tiles = offsets.size();  // = # of blocks

    exr_image->tiles = static_cast<EXRTile *>(
        malloc(sizeof(EXRTile) * static_cast<size_t>(num_tiles)));

    for (size_t tile_idx = 0; tile_idx < num_tiles; tile_idx++) {
      // Allocate memory for each tile.
      exr_image->tiles[tile_idx].images = tinyexr::AllocateImage(
          num_channels, exr_header->channels, exr_header->requested_pixel_types,
          data_width, data_height);

      // 16 byte: tile coordinates
      // 4 byte : data size
      // ~      : data(uncompressed or compressed)
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[tile_idx]);

      int tile_coordinates[4];
      memcpy(tile_coordinates, data_ptr, sizeof(int) * 4);
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[0]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[1]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[2]));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&tile_coordinates[3]));

      // @todo{ LoD }
      assert(tile_coordinates[2] == 0);
      assert(tile_coordinates[3] == 0);

      int data_len;
      memcpy(&data_len, data_ptr + 16,
             sizeof(int));  // 16 = sizeof(tile_coordinates)
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));
      assert(data_len >= 4);

      // Move to data addr: 20 = 16 + 4;
      data_ptr += 20;

      tinyexr::DecodeTiledPixelData(
          exr_image->tiles[tile_idx].images,
          &(exr_image->tiles[tile_idx].width),
          &(exr_image->tiles[tile_idx].height),
          exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, tile_coordinates[0],
          tile_coordinates[1], exr_header->tile_size_x, exr_header->tile_size_y,
          static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);

      exr_image->tiles[tile_idx].offset_x = tile_coordinates[0];
      exr_image->tiles[tile_idx].offset_y = tile_coordinates[1];
      exr_image->tiles[tile_idx].level_x = tile_coordinates[2];
      exr_image->tiles[tile_idx].level_y = tile_coordinates[3];

      exr_image->num_tiles = static_cast<int>(num_tiles);
    }
  } else {  // scanline format

    exr_image->images = tinyexr::AllocateImage(
        num_channels, exr_header->channels, exr_header->requested_pixel_types,
        data_width, data_height);

#ifdef _OPENMP
#pragma omp parallel for
#endif
    for (int y = 0; y < static_cast<int>(num_blocks); y++) {
      size_t y_idx = static_cast<size_t>(y);
      const unsigned char *data_ptr =
          reinterpret_cast<const unsigned char *>(head + offsets[y_idx]);
      // 4 byte: scan line
      // 4 byte: data size
      // ~     : pixel data(uncompressed or compressed)
      int line_no;
      memcpy(&line_no, data_ptr, sizeof(int));
      int data_len;
      memcpy(&data_len, data_ptr + 4, sizeof(int));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&line_no));
      tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

      int end_line_no = (std::min)(line_no + num_scanline_blocks,
                                   (exr_header->data_window[3] + 1));

      int num_lines = end_line_no - line_no;
      assert(num_lines > 0);

      // printf("num_blocks = %lu, y = %d, lineno = %d, end_line_no = %d,
      // num_lines = %d, data_len = %d\n", num_blocks, y, line_no, end_line_no,
      // num_lines, data_len);

      // Move to data addr: 8 = 4 + 4;
      data_ptr += 8;

      // Adjust line_no with data_window.bmin.y
      line_no -= exr_header->data_window[1];

      tinyexr::DecodePixelData(
          exr_image->images, exr_header->requested_pixel_types, data_ptr,
          static_cast<size_t>(data_len), exr_header->compression_type,
          exr_header->line_order, data_width, data_height, data_width, y,
          line_no, num_lines, static_cast<size_t>(pixel_data_size),
          static_cast<int>(exr_header->num_custom_attributes),
          exr_header->custom_attributes,
          static_cast<size_t>(exr_header->num_channels), exr_header->channels,
          channel_offset_list);
    }  // omp parallel
  }

  // Overwrite `pixel_type` with `requested_pixel_type`.
  {
    for (int c = 0; c < exr_header->num_channels; c++) {
      exr_header->pixel_types[c] = exr_header->requested_pixel_types[c];
    }
  }

  {
    exr_image->num_channels = num_channels;

    exr_image->width = data_width;
    exr_image->height = data_height;
  }

  return TINYEXR_SUCCESS;
}